

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O2

void spell_arms_of_wrath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  OBJ_DATA *obj;
  char *txt;
  OBJ_AFFECT_DATA oaf;
  AFFECT_DATA af;
  char arg [4608];
  
  target_name = one_argument(target_name,arg);
  obj = get_obj_carry(ch,arg,ch);
  if (obj == (OBJ_DATA *)0x0) {
    txt = "You aren\'t carrying that.\n\r";
  }
  else if (obj->item_type == 5) {
    bVar1 = is_affected(ch,sn);
    if (bVar1) {
      txt = "You may not commune this supplication again yet.\n\r";
    }
    else {
      bVar1 = is_affected_obj(obj,(int)gsn_arms_of_light);
      if ((((!bVar1) && (bVar1 = is_affected_obj(obj,(int)gsn_arms_of_purity), !bVar1)) &&
          (bVar1 = is_affected_obj(obj,(int)gsn_arms_of_wrath), !bVar1)) &&
         (bVar1 = is_affected_obj(obj,(int)gsn_arms_of_judgement), !bVar1)) {
        init_affect_obj(&oaf);
        oaf.where = 0;
        oaf.aftype = 4;
        oaf.location = 0;
        oaf.modifier = 0;
        oaf.duration = (short)level;
        oaf.level = ch->level;
        oaf.owner = ch;
        oaf.type = (short)sn;
        affect_to_obj(obj,&oaf);
        act("$n\'s $p is set ablaze with white flames!",ch,obj,(void *)0x0,0);
        act("You enchant $p with holy wrath.",ch,obj,(void *)0x0,3);
        init_affect(&af);
        af.where = 0;
        af.location = 0;
        af.modifier = 0;
        af.aftype = 7;
        af.level = ch->level;
        af.type = (short)sn;
        af.duration = af.level;
        affect_to_char(ch,&af);
        WAIT_STATE(ch,0x18);
        return;
      }
      txt = "This weapon is already enchanted with holy power!\n\r";
    }
  }
  else {
    txt = "You can only commune this upon weapons.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_arms_of_wrath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg[MSL];
	OBJ_DATA *weapon;
	AFFECT_DATA af;
	OBJ_AFFECT_DATA oaf;

	target_name = one_argument(target_name, arg);

	if ((weapon = get_obj_carry(ch, arg, ch)) == nullptr)
	{
		send_to_char("You aren't carrying that.\n\r", ch);
		return;
	}

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only commune this upon weapons.\n\r", ch);
		return;
	}

	if (is_affected(ch, sn))
	{
		send_to_char("You may not commune this supplication again yet.\n\r", ch);
		return;
	}

	if (is_affected_obj(weapon, gsn_arms_of_light)
		|| is_affected_obj(weapon, gsn_arms_of_purity)
		|| is_affected_obj(weapon, gsn_arms_of_wrath)
		|| is_affected_obj(weapon, gsn_arms_of_judgement))
	{
		send_to_char("This weapon is already enchanted with holy power!\n\r", ch);
		return;
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = sn;
	oaf.aftype = AFT_COMMUNE;
	oaf.location = APPLY_NONE;
	oaf.modifier = 0;
	oaf.duration = level;
	oaf.level = ch->level;
	oaf.owner = ch;
	affect_to_obj(weapon, &oaf);

	act("$n's $p is set ablaze with white flames!", ch, weapon, 0, TO_ROOM);
	act("You enchant $p with holy wrath.", ch, weapon, 0, TO_CHAR);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.aftype = AFT_TIMER;
	af.duration = ch->level;
	af.level = ch->level;
	affect_to_char(ch, &af);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}